

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int xmlCharEncInput(xmlParserInputBufferPtr input,int flush)

{
  xmlBufPtr buf_00;
  xmlBufPtr buf_01;
  xmlCharEncodingHandler *handler;
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  xmlChar *out;
  xmlChar *in;
  byte *pbVar4;
  ulong uVar5;
  int in_R9D;
  size_t sVar6;
  int iVar7;
  int c_out;
  int c_in;
  char buf [50];
  int local_70;
  int local_6c;
  char local_68 [49];
  undefined1 local_37;
  
  iVar7 = -1;
  iVar1 = -1;
  if ((((input != (xmlParserInputBufferPtr)0x0) &&
       (iVar1 = iVar7, input->encoder != (xmlCharEncodingHandlerPtr)0x0)) &&
      (buf_00 = input->buffer, buf_00 != (xmlBufPtr)0x0)) &&
     (buf_01 = input->raw, buf_01 != (xmlBufPtr)0x0)) {
    sVar2 = xmlBufUse(buf_01);
    if (sVar2 == 0) {
      iVar1 = 0;
    }
    else {
      sVar6 = 0x10000;
      if (sVar2 < 0x10000) {
        sVar6 = sVar2;
      }
      if (flush != 0) {
        sVar6 = sVar2;
      }
      sVar2 = xmlBufAvail(buf_00);
      uVar3 = 0;
      if (sVar2 != 0) {
        uVar3 = sVar2 - 1;
      }
      if (sVar6 * 2 < uVar3) {
        uVar3 = sVar2 - 1;
      }
      else {
        xmlBufGrow(buf_00,(int)(sVar6 * 2));
        sVar2 = xmlBufAvail(buf_00);
        uVar3 = 0;
        if (sVar2 != 0) {
          uVar3 = sVar2 - 1;
        }
      }
      uVar5 = 0x20000;
      if (uVar3 < 0x20000) {
        uVar5 = uVar3;
      }
      if (flush == 0) {
        uVar3 = uVar5;
      }
      local_70 = (int)uVar3;
      local_6c = (int)sVar6;
      handler = input->encoder;
      out = xmlBufEnd(buf_00);
      in = xmlBufContent(buf_01);
      iVar1 = xmlEncInputChunk(handler,out,&local_70,in,&local_6c,in_R9D);
      xmlBufShrink(buf_01,(long)local_6c);
      xmlBufAddLen(buf_00,(long)local_70);
      iVar7 = -3;
      if (iVar1 != -1) {
        iVar7 = iVar1;
      }
      if (iVar7 == -2) {
        pbVar4 = xmlBufContent(buf_01);
        snprintf(local_68,0x31,"0x%02X 0x%02X 0x%02X 0x%02X",(ulong)*pbVar4,(ulong)pbVar4[1],
                 (ulong)pbVar4[2],(uint)pbVar4[3]);
        local_37 = 0;
        __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0
                        ,(void *)0x0,0x1b,0x1773,XML_ERR_FATAL,(char *)0x0,0,local_68,(char *)0x0,
                        (char *)0x0,0,0,"input conversion failed due to input error, bytes %s\n",
                        local_68);
      }
      iVar1 = 0;
      if (iVar7 != -3) {
        iVar1 = iVar7;
      }
      if (local_70 != 0) {
        iVar1 = local_70;
      }
    }
  }
  return iVar1;
}

Assistant:

int
xmlCharEncInput(xmlParserInputBufferPtr input, int flush)
{
    int ret;
    size_t written;
    size_t toconv;
    int c_in;
    int c_out;
    xmlBufPtr in;
    xmlBufPtr out;

    if ((input == NULL) || (input->encoder == NULL) ||
        (input->buffer == NULL) || (input->raw == NULL))
        return (-1);
    out = input->buffer;
    in = input->raw;

    toconv = xmlBufUse(in);
    if (toconv == 0)
        return (0);
    if ((toconv > 64 * 1024) && (flush == 0))
        toconv = 64 * 1024;
    written = xmlBufAvail(out);
    if (written > 0)
        written--; /* count '\0' */
    if (toconv * 2 >= written) {
        xmlBufGrow(out, toconv * 2);
        written = xmlBufAvail(out);
        if (written > 0)
            written--; /* count '\0' */
    }
    if ((written > 128 * 1024) && (flush == 0))
        written = 128 * 1024;

    c_in = toconv;
    c_out = written;
    ret = xmlEncInputChunk(input->encoder, xmlBufEnd(out), &c_out,
                           xmlBufContent(in), &c_in, flush);
    xmlBufShrink(in, c_in);
    xmlBufAddLen(out, c_out);
    if (ret == -1)
        ret = -3;

    switch (ret) {
        case 0:
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                            "converted %d bytes to %d bytes of input\n",
                            c_in, c_out);
#endif
            break;
        case -1:
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                         "converted %d bytes to %d bytes of input, %d left\n",
                            c_in, c_out, (int)xmlBufUse(in));
#endif
            break;
        case -3:
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                        "converted %d bytes to %d bytes of input, %d left\n",
                            c_in, c_out, (int)xmlBufUse(in));
#endif
            break;
        case -2: {
            char buf[50];
            const xmlChar *content = xmlBufContent(in);

	    snprintf(&buf[0], 49, "0x%02X 0x%02X 0x%02X 0x%02X",
		     content[0], content[1],
		     content[2], content[3]);
	    buf[49] = 0;
	    xmlEncodingErr(XML_I18N_CONV_FAILED,
		    "input conversion failed due to input error, bytes %s\n",
		           buf);
        }
    }
    /*
     * Ignore when input buffer is not on a boundary
     */
    if (ret == -3)
        ret = 0;
    return (c_out? c_out : ret);
}